

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

void ts_parser__breakdown_lookahead
               (TSParser *self,Subtree *lookahead,TSStateId state,ReusableNode *reusable_node)

{
  uint32_t uVar1;
  bool bVar2;
  ushort uVar3;
  TSStateId TVar4;
  char *pcVar5;
  Subtree self_00;
  
  uVar1 = (reusable_node->stack).size;
  if (uVar1 == 0) {
    self_00.ptr = (SubtreeHeapData *)0x0;
  }
  else {
    self_00 = (Subtree)(reusable_node->stack).contents[uVar1 - 1].tree.ptr;
  }
  if ((((ulong)self_00.ptr & 1) == 0) && ((self_00.ptr)->child_count != 0)) {
    bVar2 = false;
    while( true ) {
      if (((ulong)self_00.ptr & 1) == 0) {
        TVar4 = (self_00.ptr)->parse_state;
      }
      else {
        TVar4 = self_00.data.parse_state;
      }
      if (TVar4 == state) break;
      if (((self->lexer).logger.log != (_func_void_void_ptr_TSLogType_char_ptr *)0x0) ||
         (self->dot_graph_file != (FILE *)0x0)) {
        if (((ulong)self_00.ptr & 1) == 0) {
          uVar3 = (self_00.ptr)->symbol;
        }
        else {
          uVar3 = (ushort)self_00.data.symbol;
        }
        pcVar5 = "ERROR";
        if (uVar3 != 0xffff) {
          if (uVar3 == 0xfffe) {
            pcVar5 = "_ERROR";
          }
          else {
            pcVar5 = self->language->symbol_names[uVar3];
          }
        }
        snprintf((self->lexer).debug_buffer,0x400,"state_mismatch sym:%s",pcVar5);
        ts_parser__log(self);
      }
      reusable_node_descend(reusable_node);
      uVar1 = (reusable_node->stack).size;
      if (uVar1 == 0) {
        self_00.ptr = (SubtreeHeapData *)0x0;
      }
      else {
        self_00 = (Subtree)(reusable_node->stack).contents[uVar1 - 1].tree.ptr;
      }
      bVar2 = true;
      if ((((ulong)self_00.ptr & 1) != 0) || ((self_00.ptr)->child_count == 0)) break;
    }
  }
  else {
    bVar2 = false;
  }
  if (!bVar2) {
    return;
  }
  ts_subtree_release(&self->tree_pool,*lookahead);
  lookahead->ptr = (SubtreeHeapData *)self_00;
  ts_subtree_retain(self_00);
  return;
}

Assistant:

static void ts_parser__breakdown_lookahead(TSParser *self, Subtree *lookahead,
                                           TSStateId state, ReusableNode *reusable_node) {
  bool did_descend = false;
  Subtree tree = reusable_node_tree(reusable_node);
  while (ts_subtree_child_count(tree) > 0 && ts_subtree_parse_state(tree) != state) {
    LOG("state_mismatch sym:%s", TREE_NAME(tree));
    reusable_node_descend(reusable_node);
    tree = reusable_node_tree(reusable_node);
    did_descend = true;
  }

  if (did_descend) {
    ts_subtree_release(&self->tree_pool, *lookahead);
    *lookahead = tree;
    ts_subtree_retain(*lookahead);
  }
}